

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::compute_delta(image_u8 *dest,image_u8 *a,image_u8 *b,uint scale)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  bool bVar5;
  undefined4 in_EAX;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  color_quad_u8 cd;
  undefined4 local_28;
  color_quad<unsigned_char,_int> local_24;
  
  if ((a->m_width == b->m_width) && (a->m_height == b->m_height)) {
    _local_28 = CONCAT44(0xff000000,in_EAX);
    image<crnlib::color_quad<unsigned_char,_int>_>::resize
              (dest,a->m_width,b->m_height,0xffffffff,&local_24);
    bVar5 = true;
    if (a->m_height != 0) {
      uVar6 = 0;
      do {
        if (a->m_width != 0) {
          uVar7 = 0;
          do {
            uVar1 = a->m_pitch;
            pcVar3 = a->m_pPixels;
            uVar2 = b->m_pitch;
            pcVar4 = b->m_pPixels;
            lVar9 = 0;
            do {
              iVar10 = ((uint)pcVar3[uVar1 * uVar6 + uVar7].field_0.c[lVar9] -
                       (uint)pcVar4[uVar2 * uVar6 + uVar7].field_0.c[lVar9]) * scale + 0x80;
              if (0xfe < iVar10) {
                iVar10 = 0xff;
              }
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              *(char *)((long)&local_28 + lVar9) = (char)iVar10;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            pcVar3 = dest->m_pPixels;
            uVar8 = dest->m_pitch * uVar6 + uVar7;
            pcVar3[uVar8].field_0.field_0.r = (uchar)local_28;
            pcVar3[uVar8].field_0.field_0.g = local_28._1_1_;
            pcVar3[uVar8].field_0.field_0.b = local_28._2_1_;
            pcVar3[uVar8].field_0.field_0.a = local_28._3_1_;
            uVar7 = uVar7 + 1;
          } while (uVar7 < a->m_width);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < a->m_height);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool compute_delta(image_u8& dest, image_u8& a, image_u8& b, uint scale)
        {
            if ((a.get_width() != b.get_width()) || (a.get_height() != b.get_height()))
            {
                return false;
            }

            dest.resize(a.get_width(), b.get_height());

            for (uint y = 0; y < a.get_height(); y++)
            {
                for (uint x = 0; x < a.get_width(); x++)
                {
                    const color_quad_u8& ca = a(x, y);
                    const color_quad_u8& cb = b(x, y);

                    color_quad_u8 cd;
                    for (uint c = 0; c < 4; c++)
                    {
                        int d = (ca[c] - cb[c]) * scale + 128;
                        d = math::clamp(d, 0, 255);
                        cd[c] = static_cast<uint8>(d);
                    }

                    dest(x, y) = cd;
                }
            }

            return true;
        }